

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::BuildStartCall(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  RealCount *pRVar1;
  ushort uVar2;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  OpLayoutStartCall *pOVar7;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  Instr *instr;
  Type pSVar8;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x17e2,"(newOpcode == Js::OpCode::StartCall)",
                       "newOpcode == Js::OpCode::StartCall");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  pOVar7 = Js::ByteCodeReader::StartCall(&this->m_jnReader);
  uVar2 = pOVar7->ArgCount;
  dstOpnd = IR::RegOpnd::New(TyVar,this->m_func);
  this->m_callsOnStack = this->m_callsOnStack + 1;
  src1Opnd = IR::IntConstOpnd::New((ulong)uVar2,TyInt32,this->m_func,false);
  instr = IR::Instr::New(newOpcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  AddInstr(this,instr,offset);
  pSVar3 = this->m_argStack;
  pSVar8 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar3->allocator,0x366bee);
  pSVar8[1].next = (Type)instr;
  pSVar8->next = (pSVar3->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pSVar3->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar8;
  pRVar1 = &(pSVar3->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void
IRBuilder::BuildStartCall(Js::OpCode newOpcode, uint32 offset)
{
    Assert(newOpcode == Js::OpCode::StartCall);

    const unaligned Js::OpLayoutStartCall * regLayout = m_jnReader.StartCall();
    Js::ArgSlot ArgCount = regLayout->ArgCount;

    IR::Instr *     instr;
    IR::RegOpnd *   dstOpnd;

    // Dst of StartCall is always r0...  Let's give it a new dst such that it can
    // be singleDef.

    dstOpnd = IR::RegOpnd::New(TyVar, m_func);

#if DBG
    m_callsOnStack++;
#endif

    IntConstType    value = ArgCount;
    IR::IntConstOpnd * srcOpnd;

    srcOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);
    instr = IR::Instr::New(newOpcode, dstOpnd, srcOpnd, m_func);

    this->AddInstr(instr, offset);

    // Keep a stack of arg instructions such that we can link them up once we see
    // the call that consumes them.

    m_argStack->Push(instr);
}